

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall ON_BinaryArchive::~ON_BinaryArchive(ON_BinaryArchive *this)

{
  ON__3dmV1LayerIndex *pOVar1;
  ON_3dmTableStatusLink *pOVar2;
  ON_3dmProperties *this_00;
  ON_3dmSettings *this_01;
  int iVar3;
  ON_TextStyle **ppOVar4;
  ON_DimStyle **ppOVar5;
  int local_40;
  int local_3c;
  int i_2;
  int i_1;
  ON_3dmTableStatusLink *p_1;
  ON_3dmTableStatusLink *next;
  ON__3dmV1LayerIndex *p;
  ON__3dmV1LayerIndex *pOStack_18;
  int i;
  ON__3dmV1LayerIndex *next_1;
  ON_BinaryArchive *this_local;
  
  this->_vptr_ON_BinaryArchive = (_func_int **)&PTR__ON_BinaryArchive_00b69b60;
  if (this->m_V1_layer_list != (ON__3dmV1LayerIndex *)0x0) {
    pOStack_18 = this->m_V1_layer_list;
    this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
    for (p._4_4_ = 0; pOStack_18 != (ON__3dmV1LayerIndex *)0x0 && p._4_4_ < 1000;
        p._4_4_ = p._4_4_ + 1) {
      pOVar1 = pOStack_18->m_next;
      onfree(pOStack_18);
      pOStack_18 = pOVar1;
    }
  }
  if (this->m_compressor != (ON_CompressorImplementation *)0x0) {
    CompressionEnd(this);
    onfree(this->m_compressor);
  }
  pOVar2 = this->m_3dm_table_status_list;
  this->m_3dm_table_status_list = (ON_3dmTableStatusLink *)0x0;
  while (p_1 = pOVar2, p_1 != (ON_3dmTableStatusLink *)0x0) {
    pOVar2 = p_1->m_next;
    if (p_1 != (ON_3dmTableStatusLink *)0x0) {
      operator_delete(p_1,0x20);
    }
  }
  ON_3dmAnnotationContext::SetReferencedDimStyle
            (&this->m_annotation_context,(ON_DimStyle *)0x0,(ON_DimStyle *)0x0,-0x7fffffff);
  if (this->m_archive_3dm_properties != (ON_3dmProperties *)0x0) {
    this_00 = this->m_archive_3dm_properties;
    if (this_00 != (ON_3dmProperties *)0x0) {
      ON_3dmProperties::~ON_3dmProperties(this_00);
      operator_delete(this_00,0x228);
    }
    this->m_archive_3dm_properties = (ON_3dmProperties *)0x0;
  }
  if (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0) {
    this_01 = this->m_archive_3dm_settings;
    if (this_01 != (ON_3dmSettings *)0x0) {
      ON_3dmSettings::~ON_3dmSettings(this_01);
      operator_delete(this_01,0x618);
    }
    this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
  }
  for (local_3c = 0;
      iVar3 = ON_SimpleArray<ON_TextStyle_*>::Count(&this->m_archive_text_style_table),
      local_3c < iVar3; local_3c = local_3c + 1) {
    ppOVar4 = ON_SimpleArray<ON_TextStyle_*>::operator[](&this->m_archive_text_style_table,local_3c)
    ;
    if (*ppOVar4 != (ON_TextStyle *)0x0) {
      ppOVar4 = ON_SimpleArray<ON_TextStyle_*>::operator[]
                          (&this->m_archive_text_style_table,local_3c);
      if (*ppOVar4 != (ON_TextStyle *)0x0) {
        (*((*ppOVar4)->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
      }
    }
  }
  ON_SimpleArray<ON_TextStyle_*>::Destroy(&this->m_archive_text_style_table);
  for (local_40 = 0; iVar3 = ON_SimpleArray<ON_DimStyle_*>::Count(&this->m_archive_dim_style_table),
      local_40 < iVar3; local_40 = local_40 + 1) {
    ppOVar5 = ON_SimpleArray<ON_DimStyle_*>::operator[](&this->m_archive_dim_style_table,local_40);
    if (*ppOVar5 != (ON_DimStyle *)0x0) {
      ppOVar5 = ON_SimpleArray<ON_DimStyle_*>::operator[](&this->m_archive_dim_style_table,local_40)
      ;
      if (*ppOVar5 != (ON_DimStyle *)0x0) {
        (*((*ppOVar5)->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
      }
    }
  }
  ON_SimpleArray<ON_DimStyle_*>::Destroy(&this->m_archive_dim_style_table);
  ON_String::~ON_String(&this->m_archive_3dm_start_section_comment);
  ON_SimpleArray<ON_DimStyle_*>::~ON_SimpleArray(&this->m_DELETE_ME_archive_dim_style_overrides);
  ON_SimpleArray<ON_DimStyle_*>::~ON_SimpleArray(&this->m_archive_dim_style_table);
  ON_SimpleArray<ON_2dex>::~ON_SimpleArray(&this->m_text_style_to_dim_style_archive_index_map);
  ON_SimpleArray<ON_TextStyle_*>::~ON_SimpleArray(&this->m_archive_text_style_table);
  ON_3dmAnnotationContext::~ON_3dmAnnotationContext(&this->m_annotation_context);
  ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray(&this->m_V3_plugin_id_list);
  ON_wString::~ON_wString(&this->m_archive_saved_as_full_path);
  ON_wString::~ON_wString(&this->m_archive_full_path);
  ON_wString::~ON_wString(&this->m_archive_directory_name);
  ON_wString::~ON_wString(&this->m_archive_file_name);
  ON_ManifestMap::~ON_ManifestMap(&this->m_manifest_map);
  ON_ComponentManifest::~ON_ComponentManifest(&this->m_manifest);
  ON_SimpleArray<ON_UserDataItemFilter>::~ON_SimpleArray(&this->m_user_data_filter);
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::~ON_SimpleArray(&this->m_chunk);
  return;
}

Assistant:

ON_BinaryArchive::~ON_BinaryArchive()
{
  if ( 0 != m_V1_layer_list )
  {
    struct ON__3dmV1LayerIndex* next = m_V1_layer_list;
    m_V1_layer_list = 0;
    for ( int i = 0; 0 != next && i < 1000; i++ )
    {
      struct ON__3dmV1LayerIndex* p = next;
      next = p->m_next;
      onfree(p);
    }
  }

  if (nullptr != m_compressor)
  {
    CompressionEnd();
    onfree(m_compressor);
  }

  ON_3dmTableStatusLink* next = m_3dm_table_status_list;
  m_3dm_table_status_list = nullptr;
  while (nullptr != next)
  {
    ON_3dmTableStatusLink* p = next;
    next = const_cast<ON_3dmTableStatusLink*>(next->m_next);
    delete p;
  }

  m_annotation_context.SetReferencedDimStyle(nullptr,nullptr,ON_UNSET_INT_INDEX);

  if (nullptr != m_archive_3dm_properties)
  {
    delete m_archive_3dm_properties;
    m_archive_3dm_properties = nullptr;
  }

  if (nullptr != m_archive_3dm_settings)
  {
    delete m_archive_3dm_settings;
    m_archive_3dm_settings = nullptr;
  }

  for (int i = 0; i < m_archive_text_style_table.Count(); i++)
  {
    if (nullptr != m_archive_text_style_table[i])
      delete m_archive_text_style_table[i];
  }
  m_archive_text_style_table.Destroy();

  for (int i = 0; i < m_archive_dim_style_table.Count(); i++)
  {
    if (nullptr != m_archive_dim_style_table[i])
      delete m_archive_dim_style_table[i];
  }
  m_archive_dim_style_table.Destroy();
}